

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

int __thiscall phosg::BitWriter::truncate(BitWriter *this,char *__file,__off_t __length)

{
  size_type sVar1;
  pointer extraout_RAX;
  pointer pcVar2;
  logic_error *this_00;
  byte bVar3;
  
  if (__file <= (char *)((this->data)._M_string_length * 8 - (ulong)this->last_byte_unset_bits)) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (&this->data,(ulong)(__file + 7) >> 3,'\0');
    bVar3 = -(char)__file & 7;
    this->last_byte_unset_bits = bVar3;
    pcVar2 = extraout_RAX;
    if (bVar3 != 0) {
      pcVar2 = (this->data)._M_dataplus._M_p;
      sVar1 = (this->data)._M_string_length;
      pcVar2[sVar1 - 1] = ((byte)pcVar2[sVar1 - 1] >> bVar3) << bVar3;
    }
    return (int)pcVar2;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error(this_00,"cannot extend a BitWriter via truncate()");
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

static inline void add_mask_bits(string* mask, bool mask_enabled, size_t num_bytes) {
  if (!mask) {
    return;
  }
  mask->append(num_bytes, mask_enabled ? '\xFF' : '\x00');
}